

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

Benchmark * __thiscall
benchmark::internal::Benchmark::Ranges
          (Benchmark *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  int iVar1;
  size_type sVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  Benchmark *in_RDI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_00000098;
  BenchmarkImp *in_stack_000000a0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar3;
  CheckHandler local_18;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_10;
  
  local_10 = in_RSI;
  iVar1 = BenchmarkImp::ArgsCnt
                    ((BenchmarkImp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  bVar3 = 0;
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt
                      ((BenchmarkImp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                      );
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(local_10);
    if (iVar1 != (int)sVar2) {
      CheckHandler::CheckHandler
                ((CheckHandler *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                 ,in_stack_ffffffffffffffd0,(char *)in_RDI,iVar1);
      bVar3 = 1;
      CheckHandler::GetLog(&local_18);
      goto LAB_00167044;
    }
  }
  GetNullLogInstance();
LAB_00167044:
  if ((bVar3 & 1) == 0) {
    BenchmarkImp::Ranges(in_stack_000000a0,in_stack_00000098);
    return in_RDI;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00167057);
}

Assistant:

Benchmark* Benchmark::Ranges(const std::vector<std::pair<int, int>>& ranges)
{
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(ranges.size()));
  imp_->Ranges(ranges);
  return this;
}